

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_descriptor.cpp
# Opt level: O0

void __thiscall
boost::iostreams::file_descriptor::file_descriptor
          (file_descriptor *this,handle_type fd,file_descriptor_flags f)

{
  file_descriptor_impl *this_00;
  file_descriptor_flags f_local;
  handle_type fd_local;
  file_descriptor *this_local;
  
  this_00 = (file_descriptor_impl *)operator_new(8);
  detail::file_descriptor_impl::file_descriptor_impl(this_00);
  shared_ptr<boost::iostreams::detail::file_descriptor_impl>::
  shared_ptr<boost::iostreams::detail::file_descriptor_impl>(&this->pimpl_,this_00);
  open(this,(char *)(ulong)(uint)fd,f);
  return;
}

Assistant:

file_descriptor::file_descriptor(handle_type fd, file_descriptor_flags f)
    : pimpl_(new impl_type)
{ open(fd, f); }